

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
FlatSigningProvider::GetTaprootSpendData
          (FlatSigningProvider *this,XOnlyPubKey *output_key,TaprootSpendData *spenddata)

{
  bool bVar1;
  long in_FS_OFFSET;
  TaprootBuilder builder;
  TaprootSpendData TStack_f8;
  TaprootBuilder local_88;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.m_valid = true;
  local_88.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_88.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_88.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  bVar1 = LookupHelper<std::map<XOnlyPubKey,TaprootBuilder,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>,XOnlyPubKey,TaprootBuilder>
                    (&this->tr_trees,output_key,&local_88);
  if (bVar1) {
    TaprootBuilder::GetSpendData(&TStack_f8,&local_88);
    TaprootSpendData::operator=(spenddata,&TStack_f8);
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::~_Rb_tree(&TStack_f8.scripts._M_t);
  }
  std::
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ::~vector(&local_88.m_branch);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetTaprootSpendData(const XOnlyPubKey& output_key, TaprootSpendData& spenddata) const
{
    TaprootBuilder builder;
    if (LookupHelper(tr_trees, output_key, builder)) {
        spenddata = builder.GetSpendData();
        return true;
    }
    return false;
}